

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O2

int nghttp2_iv_check(nghttp2_settings_entry *iv,size_t niv)

{
  uint uVar1;
  size_t sVar2;
  
  sVar2 = 0;
  do {
    if (niv == sVar2) {
      return 1;
    }
    switch(iv[sVar2].settings_id) {
    case 2:
    case 8:
      uVar1 = iv[sVar2].value;
      goto joined_r0x004d63ad;
    case 4:
      if ((int)iv[sVar2].value < 0) {
        return 0;
      }
      break;
    case 5:
      if (iv[sVar2].value - 0x1000000 < 0xff004000) {
        return 0;
      }
      break;
    case 9:
      uVar1 = iv[sVar2].value;
joined_r0x004d63ad:
      if (1 < uVar1) {
        return 0;
      }
    }
    sVar2 = sVar2 + 1;
  } while( true );
}

Assistant:

int nghttp2_iv_check(const nghttp2_settings_entry *iv, size_t niv) {
  size_t i;
  for (i = 0; i < niv; ++i) {
    switch (iv[i].settings_id) {
    case NGHTTP2_SETTINGS_HEADER_TABLE_SIZE:
      break;
    case NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS:
      break;
    case NGHTTP2_SETTINGS_ENABLE_PUSH:
      if (iv[i].value != 0 && iv[i].value != 1) {
        return 0;
      }
      break;
    case NGHTTP2_SETTINGS_INITIAL_WINDOW_SIZE:
      if (iv[i].value > (uint32_t)NGHTTP2_MAX_WINDOW_SIZE) {
        return 0;
      }
      break;
    case NGHTTP2_SETTINGS_MAX_FRAME_SIZE:
      if (iv[i].value < NGHTTP2_MAX_FRAME_SIZE_MIN ||
          iv[i].value > NGHTTP2_MAX_FRAME_SIZE_MAX) {
        return 0;
      }
      break;
    case NGHTTP2_SETTINGS_MAX_HEADER_LIST_SIZE:
      break;
    case NGHTTP2_SETTINGS_ENABLE_CONNECT_PROTOCOL:
      if (iv[i].value != 0 && iv[i].value != 1) {
        return 0;
      }
      break;
    case NGHTTP2_SETTINGS_NO_RFC7540_PRIORITIES:
      if (iv[i].value != 0 && iv[i].value != 1) {
        return 0;
      }
      break;
    }
  }
  return 1;
}